

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O0

void remove_node(chan_X11_list *elem)

{
  chan_X11_list *__ptr;
  chan_X11_list *current_node;
  chan_X11_list *elem_local;
  
  __ptr = gp_x11_chan;
  if (gp_x11_chan == elem) {
    gp_x11_chan = gp_x11_chan->next;
    free(__ptr);
  }
  else {
    do {
      if (gp_x11_chan->next == (chan_X11_list *)0x0) {
        return;
      }
    } while (gp_x11_chan->next != elem);
    gp_x11_chan->next = gp_x11_chan->next->next;
    free(__ptr->next);
  }
  return;
}

Assistant:

static void remove_node(struct chan_X11_list *elem)
{
    struct chan_X11_list *current_node = NULL;

    current_node = gp_x11_chan;

    if(gp_x11_chan == elem) {
        gp_x11_chan = gp_x11_chan->next;
        free(current_node);
        return;
    }

    while(current_node->next) {
        if(current_node->next == elem) {
            current_node->next = current_node->next->next;
            current_node = current_node->next;
            free(current_node);
            break;
        }
    }
}